

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

int __thiscall el::base::SubsecondPrecision::init(SubsecondPrecision *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 3;
  if (0xfffffff9 < (int)ctx - 7U) {
    iVar1 = (int)ctx;
  }
  this->m_width = iVar1;
  uVar2 = iVar1 - 4;
  uVar3 = 1000;
  if (uVar2 < 3) {
    uVar3 = *(uint *)(&DAT_0016bb98 + (ulong)uVar2 * 4);
  }
  this->m_offset = uVar3;
  return uVar2;
}

Assistant:

void SubsecondPrecision::init(int width) {
  if (width < 1 || width > 6) {
    width = base::consts::kDefaultSubsecondPrecision;
  }
  m_width = width;
  switch (m_width) {
  case 3:
    m_offset = 1000;
    break;
  case 4:
    m_offset = 100;
    break;
  case 5:
    m_offset = 10;
    break;
  case 6:
    m_offset = 1;
    break;
  default:
    m_offset = 1000;
    break;
  }
}